

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

int ON_CompareDoubleArray(size_t count,double *a,double *b)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  
  iVar1 = 0;
  if (a != b && count != 0) {
    if (a == (double *)0x0) {
      return 1;
    }
    if (b != (double *)0x0) {
      pdVar2 = a + 1;
      do {
        iVar1 = ON_CompareDouble(pdVar2[-1],*b);
        if (iVar1 != 0) {
          return iVar1;
        }
        b = b + 1;
        bVar3 = pdVar2 < a + count;
        pdVar2 = pdVar2 + 1;
      } while (bVar3);
      return 0;
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ON_CompareDoubleArray(
  size_t count,
  const double* a,
  const double* b
  )
{
  if (count <= 0)
    return 0;
  if (a == b)
    return 0;
  if (nullptr == a)
    return 1;
  if (nullptr == b)
    return -1;
  return Internal_DoubleArrayCompare(count, a, b);
}